

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_predicated_token(Context *ctx)

{
  int iVar1;
  SourceArgInfo *arg;
  Context *ctx_local;
  
  parse_source_token(ctx,&ctx->predicate_arg);
  if ((ctx->predicate_arg).regtype != REG_TYPE_MAX) {
    fail(ctx,"Predicated instruction but not predicate register!");
  }
  if (((ctx->predicate_arg).src_mod != SRCMOD_NONE) && ((ctx->predicate_arg).src_mod != SRCMOD_NOT))
  {
    fail(ctx,"Predicated instruction register is not NONE or NOT");
  }
  iVar1 = no_swizzle((ctx->predicate_arg).swizzle);
  if (iVar1 == 0) {
    iVar1 = replicate_swizzle((ctx->predicate_arg).swizzle);
    if (iVar1 == 0) {
      fail(ctx,"Predicated instruction register has wrong swizzle");
    }
  }
  if ((ctx->predicate_arg).relative != 0) {
    fail(ctx,"relative addressing in predicated token");
  }
  return 1;
}

Assistant:

static int parse_predicated_token(Context *ctx)
{
    SourceArgInfo *arg = &ctx->predicate_arg;
    parse_source_token(ctx, arg);
    if (arg->regtype != REG_TYPE_PREDICATE)
        fail(ctx, "Predicated instruction but not predicate register!");
    if ((arg->src_mod != SRCMOD_NONE) && (arg->src_mod != SRCMOD_NOT))
        fail(ctx, "Predicated instruction register is not NONE or NOT");
    if ( !no_swizzle(arg->swizzle) && !replicate_swizzle(arg->swizzle) )
        fail(ctx, "Predicated instruction register has wrong swizzle");
    if (arg->relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in predicated token");

    return 1;
}